

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

shared_ptr<vmips::VirtReg> __thiscall
vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  element_type *peVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  shared_ptr<vmips::VirtReg> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::VirtReg> sVar4;
  shared_ptr<vmips::VirtReg> *local_100;
  shared_ptr<vmips::Instruction> local_b8 [2];
  allocator<std::shared_ptr<vmips::VirtReg>_> local_91;
  shared_ptr<vmips::VirtReg> local_90;
  shared_ptr<vmips::VirtReg> local_80;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_70;
  undefined1 local_58 [16];
  shared_ptr<vmips::callfunc> calling;
  shared_ptr<vmips::VirtReg> *args_local;
  weak_ptr<vmips::Function> *target_local;
  Function *this_local;
  shared_ptr<vmips::VirtReg> *ret;
  
  vmips::VirtReg::create();
  *(undefined1 *)
   &target[0x10].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1
  ;
  this_00 = &calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<vmips::Function>::lock((weak_ptr<vmips::Function> *)this_00);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  puVar2 = std::max<unsigned_long>
                     ((unsigned_long *)(target + 0x11),(unsigned_long *)(peVar1 + 0x128));
  target[0x11].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*puVar2;
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)this_00);
  local_58._0_8_ = target;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_90,in_RCX);
  local_80.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_80.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_90;
  std::allocator<std::shared_ptr<vmips::VirtReg>_>::allocator(&local_91);
  __l._M_len = (size_type)
               local_80.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_80.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_70,__l,&local_91);
  std::
  make_shared<vmips::callfunc,std::shared_ptr<vmips::VirtReg>&,vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            ((shared_ptr<vmips::VirtReg> *)(local_58 + 8),(Function **)this,
             (weak_ptr<vmips::Function> *)local_58,
             (vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              *)args);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_70);
  std::allocator<std::shared_ptr<vmips::VirtReg>_>::~allocator(&local_91);
  local_100 = &local_80;
  do {
    local_100 = local_100 + -1;
    std::shared_ptr<vmips::VirtReg>::~shared_ptr(local_100);
  } while (local_100 != &local_90);
  peVar3 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&target[0x14].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::callfunc,void>
            (local_b8,(shared_ptr<vmips::callfunc> *)(local_58 + 8));
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(peVar3 + 0x30),local_b8);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(local_b8);
  std::shared_ptr<vmips::callfunc>::~shared_ptr((shared_ptr<vmips::callfunc> *)(local_58 + 8));
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> call(std::weak_ptr<Function> target, Args &&... args) {
            auto ret = VirtReg::create();
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(ret, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
            return ret;
        }